

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void show_difference(roaring_bitmap_t *result,roaring_bitmap_t *hopedfor)

{
  _Bool _Var1;
  uint val;
  int iVar2;
  
  val = 0;
  iVar2 = 0;
  while( true ) {
    _Var1 = roaring_bitmap_contains(result,val);
    if (_Var1) {
      _Var1 = roaring_bitmap_contains(hopedfor,val);
      if (!_Var1) {
        printf("result incorrectly has %d\n",(ulong)val);
        iVar2 = iVar2 + 1;
      }
    }
    _Var1 = roaring_bitmap_contains(result,val);
    if (!_Var1) {
      _Var1 = roaring_bitmap_contains(hopedfor,val);
      if (_Var1) {
        printf("result incorrectly omits %d\n",(ulong)val);
        iVar2 = iVar2 + 1;
      }
    }
    if (0x14 < iVar2) break;
    val = val + 1;
    if (val == 10000000) {
      return;
    }
  }
  puts("20 errors seen, stopping comparison");
  return;
}

Assistant:

static void show_difference(roaring_bitmap_t *result,
                            roaring_bitmap_t *hopedfor) {
    int out_ctr = 0;
    for (int i = 0; i < 10000000; ++i) {
        if (roaring_bitmap_contains(result, i) &&
            !roaring_bitmap_contains(hopedfor, i)) {
            printf("result incorrectly has %d\n", i);
            ++out_ctr;
        }
        if (!roaring_bitmap_contains(result, i) &&
            roaring_bitmap_contains(hopedfor, i)) {
            printf("result incorrectly omits %d\n", i);
            ++out_ctr;
        }
        if (out_ctr > 20) {
            printf("20 errors seen, stopping comparison\n");
            break;
        }
    }
}